

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

string * cmGeneratorExpressionNode::EvaluateDependentExpression
                   (string *__return_storage_ptr__,string *prop,cmMakefile *makefile,
                   cmGeneratorExpressionContext *context,cmTarget *headTarget,
                   cmTarget *currentTarget,cmGeneratorExpressionDAGChecker *dagChecker)

{
  cmGeneratorExpression this;
  char *pcVar1;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression local_48;
  cmGeneratorExpression ge;
  
  cmGeneratorExpression::cmGeneratorExpression(&ge,&context->Backtrace);
  cmGeneratorExpression::Parse(&local_48,(string *)&ge);
  this.Backtrace = local_48.Backtrace;
  local_48.Backtrace = (cmListFileBacktrace *)0x0;
  cge.x_ = (cmCompiledGeneratorExpression *)this.Backtrace;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&local_48);
  *(bool *)&this.Backtrace[8].super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
            super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
            super__Vector_impl_data._M_finish = context->EvaluateForBuildsystem;
  pcVar1 = cmCompiledGeneratorExpression::Evaluate
                     ((cmCompiledGeneratorExpression *)this.Backtrace,makefile,&context->Config,
                      context->Quiet,headTarget,currentTarget,dagChecker,&context->Language);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_48);
  if ((cge.x_)->HadContextSensitiveCondition == true) {
    context->HadContextSensitiveCondition = true;
  }
  if ((cge.x_)->HadHeadSensitiveCondition == true) {
    context->HadHeadSensitiveCondition = true;
  }
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpressionNode::EvaluateDependentExpression(
    std::string const& prop, cmMakefile *makefile,
    cmGeneratorExpressionContext *context,
    cmTarget const* headTarget, cmTarget const* currentTarget,
    cmGeneratorExpressionDAGChecker *dagChecker)
{
  cmGeneratorExpression ge(&context->Backtrace);
  cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(prop);
  cge->SetEvaluateForBuildsystem(context->EvaluateForBuildsystem);
  std::string result = cge->Evaluate(makefile,
                        context->Config,
                        context->Quiet,
                        headTarget,
                        currentTarget,
                        dagChecker,
                        context->Language);
  if (cge->GetHadContextSensitiveCondition())
    {
    context->HadContextSensitiveCondition = true;
    }
  if (cge->GetHadHeadSensitiveCondition())
    {
    context->HadHeadSensitiveCondition = true;
    }
  return result;
}